

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::Ifc2DCompositeCurve::~Ifc2DCompositeCurve(Ifc2DCompositeCurve *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *pvVar1;
  
  (this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x91daa8;
  *(undefined8 *)&(this->super_IfcCompositeCurve).field_0x88 = 0x91db70;
  *(undefined8 *)
   &(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x91dad0;
  *(undefined8 *)
   &(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x91daf8;
  *(undefined8 *)
   &(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.
    super_IfcGeometricRepresentationItem.field_0x30 = 0x91db20;
  *(undefined8 *)&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.super_IfcCurve.field_0x40 =
       0x91db48;
  this_00 = (this->super_IfcCompositeCurve).SelfIntersect.
            super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pvVar1 = *(void **)&(this->super_IfcCompositeCurve).super_IfcBoundedCurve.field_0x50;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

Ifc2DCompositeCurve() : Object("Ifc2DCompositeCurve") {}